

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O0

void copy_header_external
               (Curl_header_store *hs,size_t index,size_t amount,Curl_llist_node *e,
               curl_header *hout)

{
  curl_header *h;
  curl_header *hout_local;
  Curl_llist_node *e_local;
  size_t amount_local;
  size_t index_local;
  Curl_header_store *hs_local;
  
  hout->name = hs->name;
  hout->value = hs->value;
  hout->amount = amount;
  hout->index = index;
  hout->origin = hs->type | 0x8000000;
  hout->anchor = e;
  return;
}

Assistant:

static void copy_header_external(struct Curl_header_store *hs,
                                 size_t index,
                                 size_t amount,
                                 struct Curl_llist_node *e,
                                 struct curl_header *hout)
{
  struct curl_header *h = hout;
  h->name = hs->name;
  h->value = hs->value;
  h->amount = amount;
  h->index = index;
  /* this will randomly OR a reserved bit for the sole purpose of making it
     impossible for applications to do == comparisons, as that would otherwise
     be very tempting and then lead to the reserved bits not being reserved
     anymore. */
  h->origin = (unsigned int)(hs->type | (1 << 27));
  h->anchor = e;
}